

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint32_t __thiscall AmpIO::GetSafetyAmpDisable(AmpIO *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint index;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x514c4131) {
    uVar4 = this->ReadBuffer[1] >> 4 & 0xf;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    uVar4 = 0;
    if ((uVar2 == 0x44514c41) && (this->NumMotors != 0)) {
      index = 0;
      uVar4 = 0;
      do {
        bVar1 = GetSafetyAmpDisable(this,index);
        uVar3 = 1 << ((byte)index & 0x1f);
        if (!bVar1) {
          uVar3 = 0;
        }
        uVar4 = uVar4 | uVar3;
        index = index + 1;
      } while (index < this->NumMotors);
    }
  }
  return uVar4;
}

Assistant:

uint32_t AmpIO::GetSafetyAmpDisable(void) const
{
    uint32_t ampStatus = 0;
    if (GetHardwareVersion() == QLA1_String) {
        ampStatus = (GetStatus() & 0x000000F0) >> 4;
    }
    else if (GetHardwareVersion() == DQLA_String) {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if (GetSafetyAmpDisable(i))
                ampStatus |= (1 << i);
        }
    }
    return ampStatus;
}